

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall
QHttpNetworkRequest::prependHeaderField(QHttpNetworkRequest *this,QByteArray *name,QByteArray *data)

{
  QByteArray *in_RDX;
  QHttpNetworkHeaderPrivate *in_RSI;
  
  QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
            ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)in_RSI);
  QHttpNetworkHeaderPrivate::prependHeaderField(in_RSI,in_RDX,(QByteArray *)0x30a2d5);
  return;
}

Assistant:

void QHttpNetworkRequest::prependHeaderField(const QByteArray &name, const QByteArray &data)
{
    d->prependHeaderField(name, data);
}